

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bijectionmap.h
# Opt level: O0

size_t __thiscall
Common::
SerialBijectionMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::operator[](SerialBijectionMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  size_t sVar1;
  undefined8 local_20;
  size_t id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_local;
  SerialBijectionMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  local_20 = findKey(this,key);
  sVar1 = size(this);
  if (local_20 == sVar1) {
    local_20 = currentIndex(this);
    insert(this,key);
  }
  return local_20;
}

Assistant:

size_t operator[](const _KTy &key) {
		size_t id = findKey(key);
		if (id == size()) {
			id = currentIndex();
			insert(key);
		}
		return id;
	}